

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beamsplitter.cpp
# Opt level: O3

void beamsplitter_64(void *key,int len,uint seed,void *out)

{
  long lVar1;
  bool bVar2;
  byte bVar3;
  char cVar4;
  uint64_t *puVar5;
  uint uVar6;
  uint64_t uVar7;
  ulong uVar8;
  byte bVar9;
  ulong uVar10;
  ulong *puVar11;
  uint uVar12;
  uint uVar13;
  uint64_t uVar14;
  uint64_t *puVar15;
  uint uVar16;
  byte bVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  uint64_t uVar21;
  ulong uVar22;
  ulong *puVar23;
  uint uVar24;
  long lVar25;
  int iVar26;
  ulong uVar27;
  int Len;
  
  puVar15 = state;
  uVar6 = len >> 3;
  uVar20 = (ulong)uVar6;
  *state = 0x123456789abcdef0;
  puVar15[1] = 0xfedcba987654321;
  puVar15[2] = 0xaccadacca80081e5;
  puVar15[3] = 0xf00baaf00f00baaa;
  if ((int)uVar6 < 1) {
    uVar13 = 0;
    uVar14 = 0x123456789abcdef0;
    uVar7 = 0xfedcba987654321;
  }
  else {
    lVar25 = 1;
    iVar26 = 0;
    do {
      uVar22 = *(long *)((long)key + lVar25 * 8 + -8) + lVar25;
      bVar3 = (char)lVar25 + (char)puVar15[iVar26] & 0x3f;
      puVar15[iVar26] = (uVar22 >> bVar3 | uVar22 << 0x40 - bVar3) + puVar15[iVar26];
      puVar11 = puVar15 + 1;
      puVar23 = puVar15;
      if (iVar26 == 1) {
LAB_0016e349:
        uVar22 = *puVar23;
        uVar27 = T[(uint)uVar22 & 0x3ff] + uVar22 + *puVar11;
        *puVar23 = uVar27;
        uVar10 = uVar22 << ((ulong)(byte)-((byte)uVar27 & 0x3f) & 0x3f) | uVar22 >> (uVar27 & 0x3f);
        if ((uVar27 & 0x3f) == 0) {
          uVar10 = uVar22;
        }
        *puVar11 = uVar10;
      }
      else if (iVar26 == 3) {
        iVar26 = -1;
        puVar11 = puVar15 + 3;
        puVar23 = puVar15 + 2;
        goto LAB_0016e349;
      }
      lVar1 = (1 - uVar20) + lVar25;
      iVar26 = iVar26 + 1;
      lVar25 = lVar25 + 1;
    } while (lVar1 != 1);
    uVar14 = *puVar15;
    uVar7 = puVar15[1];
    uVar13 = uVar6;
  }
  uVar16 = uVar13 * 8;
  uVar7 = T[(uint)uVar14 & 0x3ff] + uVar14 + uVar7;
  *puVar15 = uVar7;
  uVar21 = uVar14 << ((ulong)(byte)-((byte)uVar7 & 0x3f) & 0x3f) | uVar14 >> (uVar7 & 0x3f);
  if ((uVar7 & 0x3f) == 0) {
    uVar21 = uVar14;
  }
  puVar15[1] = uVar21;
  if ((int)uVar16 < len) {
    uVar24 = uVar16 & 0x18;
    lVar25 = 0;
    uVar12 = uVar16;
    do {
      cVar4 = (char)uVar13 * '\b' + '\x01' + (char)lVar25;
      bVar17 = *(char *)((long)key + lVar25 + (ulong)uVar13 * 8) + cVar4;
      bVar3 = state8[(int)uVar24];
      bVar9 = cVar4 + bVar3 & 7;
      bVar9 = bVar17 >> bVar9 | bVar17 << 8 - bVar9;
      if ((bVar3 + 1 + (int)lVar25 & 7) == 0) {
        bVar9 = bVar17;
      }
      uVar19 = (ulong)(uVar16 + (uVar12 / 3) * -3 + (int)lVar25);
      state8[(int)uVar24] = bVar9 + bVar3;
      puVar15 = state;
      uVar22 = state[uVar19];
      uVar27 = T[(uint)uVar22 & 0x3ff] + uVar22 + state[uVar19 + 1];
      state[uVar19] = uVar27;
      uVar10 = uVar22 << ((ulong)(byte)-((byte)uVar27 & 0x3f) & 0x3f) | uVar22 >> (uVar27 & 0x3f);
      if ((uVar27 & 0x3f) == 0) {
        uVar10 = uVar22;
      }
      bVar2 = 0x1e < (int)uVar24;
      uVar24 = uVar24 + 1;
      if (bVar2) {
        uVar24 = 0;
      }
      lVar25 = lVar25 + 1;
      uVar12 = uVar12 + 1;
      puVar15[uVar19 + 1] = uVar10;
    } while ((ulong)(uint)len + (ulong)uVar13 * -8 != lVar25);
    uVar7 = *puVar15;
    uVar21 = puVar15[1];
  }
  uVar22 = T[(uint)uVar7 & 0x3ff] + uVar7 + uVar21;
  uVar10 = uVar7 << ((ulong)(byte)-((byte)uVar22 & 0x3f) & 0x3f) | uVar7 >> (uVar22 & 0x3f);
  if ((uVar22 & 0x3f) == 0) {
    uVar10 = uVar7;
  }
  uVar27 = puVar15[2] + T[(uint)uVar10 & 0x3ff] + uVar10;
  uVar19 = uVar10 << ((ulong)(byte)-((byte)uVar27 & 0x3f) & 0x3f) | uVar10 >> (uVar27 & 0x3f);
  if ((uVar27 & 0x3f) == 0) {
    uVar19 = uVar10;
  }
  uVar14 = T[(uint)uVar19 & 0x3ff];
  *puVar15 = uVar22;
  puVar15[1] = uVar27;
  uVar18 = puVar15[3] + uVar14 + uVar19;
  puVar15[2] = uVar18;
  uVar10 = uVar19 << ((ulong)(byte)-((byte)uVar18 & 0x3f) & 0x3f) | uVar19 >> (uVar18 & 0x3f);
  if ((uVar18 & 0x3f) == 0) {
    uVar10 = uVar19;
  }
  puVar15[3] = uVar10;
  if ((int)uVar6 < 1) {
    uVar13 = 0;
  }
  else {
    lVar25 = 1;
    iVar26 = 0;
    do {
      uVar22 = *(long *)((long)key + lVar25 * 8 + -8) + lVar25;
      bVar3 = (char)lVar25 + (char)puVar15[iVar26] & 0x3f;
      puVar15[iVar26] = (uVar22 >> bVar3 | uVar22 << 0x40 - bVar3) + puVar15[iVar26];
      puVar11 = puVar15 + 1;
      puVar23 = puVar15;
      if (iVar26 == 1) {
LAB_0016e61d:
        uVar22 = *puVar23;
        uVar27 = T[(uint)uVar22 & 0x3ff] + uVar22 + *puVar11;
        *puVar23 = uVar27;
        uVar10 = uVar22 << ((ulong)(byte)-((byte)uVar27 & 0x3f) & 0x3f) | uVar22 >> (uVar27 & 0x3f);
        if ((uVar27 & 0x3f) == 0) {
          uVar10 = uVar22;
        }
        *puVar11 = uVar10;
      }
      else if (iVar26 == 3) {
        iVar26 = -1;
        puVar11 = puVar15 + 3;
        puVar23 = puVar15 + 2;
        goto LAB_0016e61d;
      }
      lVar1 = (1 - uVar20) + lVar25;
      iVar26 = iVar26 + 1;
      lVar25 = lVar25 + 1;
    } while (lVar1 != 1);
    uVar22 = *puVar15;
    uVar27 = puVar15[1];
    uVar13 = uVar6;
  }
  uVar16 = uVar13 * 8;
  uVar14 = T[(uint)uVar22 & 0x3ff] + uVar22 + uVar27;
  *puVar15 = uVar14;
  uVar10 = uVar22 << ((ulong)(byte)-((byte)uVar14 & 0x3f) & 0x3f) | uVar22 >> (uVar14 & 0x3f);
  if ((uVar14 & 0x3f) == 0) {
    uVar10 = uVar22;
  }
  puVar15[1] = uVar10;
  if ((int)uVar16 < len) {
    uVar24 = uVar16 & 0x18;
    lVar25 = 0;
    uVar12 = uVar16;
    do {
      cVar4 = (char)uVar13 * '\b' + '\x01' + (char)lVar25;
      bVar17 = *(char *)((long)key + lVar25 + (ulong)uVar13 * 8) + cVar4;
      bVar3 = state8[(int)uVar24];
      bVar9 = cVar4 + bVar3 & 7;
      bVar9 = bVar17 >> bVar9 | bVar17 << 8 - bVar9;
      if ((bVar3 + 1 + (int)lVar25 & 7) == 0) {
        bVar9 = bVar17;
      }
      uVar19 = (ulong)(uVar16 + (uVar12 / 3) * -3 + (int)lVar25);
      state8[(int)uVar24] = bVar9 + bVar3;
      puVar15 = state;
      uVar22 = state[uVar19];
      uVar27 = T[(uint)uVar22 & 0x3ff] + uVar22 + state[uVar19 + 1];
      state[uVar19] = uVar27;
      uVar10 = uVar22 << ((ulong)(byte)-((byte)uVar27 & 0x3f) & 0x3f) | uVar22 >> (uVar27 & 0x3f);
      if ((uVar27 & 0x3f) == 0) {
        uVar10 = uVar22;
      }
      bVar2 = 0x1e < (int)uVar24;
      uVar24 = uVar24 + 1;
      if (bVar2) {
        uVar24 = 0;
      }
      lVar25 = lVar25 + 1;
      uVar12 = uVar12 + 1;
      puVar15[uVar19 + 1] = uVar10;
    } while ((ulong)(uint)len + (ulong)uVar13 * -8 != lVar25);
    uVar14 = *puVar15;
    uVar10 = puVar15[1];
  }
  uVar10 = T[(uint)uVar14 & 0x3ff] + uVar14 + uVar10;
  uVar22 = uVar14 << ((ulong)(byte)-((byte)uVar10 & 0x3f) & 0x3f) | uVar14 >> (uVar10 & 0x3f);
  if ((uVar10 & 0x3f) == 0) {
    uVar22 = uVar14;
  }
  uVar27 = puVar15[2] + T[(uint)uVar22 & 0x3ff] + uVar22;
  uVar19 = uVar22 << ((ulong)(byte)-((byte)uVar27 & 0x3f) & 0x3f) | uVar22 >> (uVar27 & 0x3f);
  if ((uVar27 & 0x3f) == 0) {
    uVar19 = uVar22;
  }
  uVar14 = T[(uint)uVar19 & 0x3ff];
  *puVar15 = uVar10;
  puVar15[1] = uVar27;
  uVar18 = puVar15[3] + uVar14 + uVar19;
  puVar15[2] = uVar18;
  uVar22 = uVar19 << ((ulong)(byte)-((byte)uVar18 & 0x3f) & 0x3f) | uVar19 >> (uVar18 & 0x3f);
  if ((uVar18 & 0x3f) == 0) {
    uVar22 = uVar19;
  }
  puVar15[3] = uVar22;
  if ((int)uVar6 < 1) {
    uVar13 = 0;
  }
  else {
    lVar25 = 1;
    iVar26 = 0;
    do {
      uVar22 = *(long *)((long)key + lVar25 * 8 + -8) + lVar25;
      bVar3 = (char)lVar25 + (char)puVar15[iVar26] & 0x3f;
      puVar15[iVar26] = (uVar22 >> bVar3 | uVar22 << 0x40 - bVar3) + puVar15[iVar26];
      puVar11 = puVar15 + 1;
      puVar23 = puVar15;
      if (iVar26 == 1) {
LAB_0016e8d3:
        uVar22 = *puVar23;
        uVar27 = T[(uint)uVar22 & 0x3ff] + uVar22 + *puVar11;
        *puVar23 = uVar27;
        uVar10 = uVar22 << ((ulong)(byte)-((byte)uVar27 & 0x3f) & 0x3f) | uVar22 >> (uVar27 & 0x3f);
        if ((uVar27 & 0x3f) == 0) {
          uVar10 = uVar22;
        }
        *puVar11 = uVar10;
      }
      else if (iVar26 == 3) {
        iVar26 = -1;
        puVar11 = puVar15 + 3;
        puVar23 = puVar15 + 2;
        goto LAB_0016e8d3;
      }
      lVar1 = (1 - uVar20) + lVar25;
      iVar26 = iVar26 + 1;
      lVar25 = lVar25 + 1;
    } while (lVar1 != 1);
    uVar10 = *puVar15;
    uVar27 = puVar15[1];
    uVar13 = uVar6;
  }
  uVar14 = T[(uint)uVar10 & 0x3ff] + uVar10 + uVar27;
  *puVar15 = uVar14;
  uVar16 = uVar13 * 8;
  uVar22 = uVar10 << ((ulong)(byte)-((byte)uVar14 & 0x3f) & 0x3f) | uVar10 >> (uVar14 & 0x3f);
  if ((uVar14 & 0x3f) == 0) {
    uVar22 = uVar10;
  }
  puVar15[1] = uVar22;
  if ((int)uVar16 < len) {
    uVar24 = uVar16 & 0x18;
    lVar25 = 0;
    uVar12 = uVar16;
    do {
      bVar3 = state8[(int)uVar24];
      cVar4 = (char)uVar13 * '\b' + '\x01' + (char)lVar25;
      bVar17 = *(char *)((long)key + lVar25 + (ulong)uVar13 * 8) + cVar4;
      bVar9 = cVar4 + bVar3 & 7;
      bVar9 = bVar17 >> bVar9 | bVar17 << 8 - bVar9;
      if ((bVar3 + 1 + (int)lVar25 & 7) == 0) {
        bVar9 = bVar17;
      }
      uVar19 = (ulong)(uVar16 + (uVar12 / 3) * -3 + (int)lVar25);
      state8[(int)uVar24] = bVar9 + bVar3;
      puVar15 = state;
      uVar22 = state[uVar19];
      uVar27 = T[(uint)uVar22 & 0x3ff] + uVar22 + state[uVar19 + 1];
      state[uVar19] = uVar27;
      uVar10 = uVar22 << ((ulong)(byte)-((byte)uVar27 & 0x3f) & 0x3f) | uVar22 >> (uVar27 & 0x3f);
      if ((uVar27 & 0x3f) == 0) {
        uVar10 = uVar22;
      }
      bVar2 = 0x1e < (int)uVar24;
      uVar24 = uVar24 + 1;
      if (bVar2) {
        uVar24 = 0;
      }
      lVar25 = lVar25 + 1;
      uVar12 = uVar12 + 1;
      puVar15[uVar19 + 1] = uVar10;
    } while ((ulong)(uint)len + (ulong)uVar13 * -8 != lVar25);
    uVar14 = *puVar15;
    uVar22 = puVar15[1];
  }
  uVar22 = T[(uint)uVar14 & 0x3ff] + uVar14 + uVar22;
  uVar10 = uVar14 << ((ulong)(byte)-((byte)uVar22 & 0x3f) & 0x3f) | uVar14 >> (uVar22 & 0x3f);
  if ((uVar22 & 0x3f) == 0) {
    uVar10 = uVar14;
  }
  uVar19 = puVar15[2] + T[(uint)uVar10 & 0x3ff] + uVar10;
  uVar27 = uVar10 << ((ulong)(byte)-((byte)uVar19 & 0x3f) & 0x3f) | uVar10 >> (uVar19 & 0x3f);
  if ((uVar19 & 0x3f) == 0) {
    uVar27 = uVar10;
  }
  uVar18 = puVar15[3] + T[(uint)uVar27 & 0x3ff] + uVar27;
  uVar10 = uVar27 << ((ulong)(byte)-((byte)uVar18 & 0x3f) & 0x3f) | uVar27 >> (uVar18 & 0x3f);
  if ((uVar18 & 0x3f) == 0) {
    uVar10 = uVar27;
  }
  uVar27 = ((ulong)(seed - 2) << 0x20) + 1 + (ulong)(0xc5550690 - seed);
  bVar3 = (byte)uVar22 + 1 & 0x3f;
  uVar22 = (uVar27 >> bVar3 | uVar27 << 0x40 - bVar3) + uVar22;
  uVar19 = T[(uint)uVar22 & 0x3ff] + uVar22 + uVar19;
  uVar8 = uVar22 << ((ulong)(byte)-((byte)uVar19 & 0x3f) & 0x3f) | uVar22 >> (uVar19 & 0x3f);
  if ((uVar19 & 0x3f) == 0) {
    uVar8 = uVar22;
  }
  uVar8 = T[(uint)uVar19 & 0x3ff] + uVar19 + uVar8;
  uVar22 = uVar19 << ((ulong)(byte)-((byte)uVar8 & 0x3f) & 0x3f) | uVar19 >> (uVar8 & 0x3f);
  if ((uVar8 & 0x3f) == 0) {
    uVar22 = uVar19;
  }
  uVar18 = uVar18 + T[(uint)uVar22 & 0x3ff] + uVar22;
  uVar19 = uVar22 << ((ulong)(byte)-((byte)uVar18 & 0x3f) & 0x3f) | uVar22 >> (uVar18 & 0x3f);
  if ((uVar18 & 0x3f) == 0) {
    uVar19 = uVar22;
  }
  uVar10 = uVar10 + T[(uint)uVar19 & 0x3ff] + uVar19;
  uVar22 = uVar19 << ((ulong)(byte)-((byte)uVar10 & 0x3f) & 0x3f) | uVar19 >> (uVar10 & 0x3f);
  if ((uVar10 & 0x3f) == 0) {
    uVar22 = uVar19;
  }
  bVar3 = (byte)uVar8 + 1 & 0x3f;
  uVar8 = (uVar27 >> bVar3 | uVar27 << 0x40 - bVar3) + uVar8;
  uVar18 = T[(uint)uVar8 & 0x3ff] + uVar8 + uVar18;
  uVar27 = uVar8 << ((ulong)(byte)-((byte)uVar18 & 0x3f) & 0x3f) | uVar8 >> (uVar18 & 0x3f);
  if ((uVar18 & 0x3f) == 0) {
    uVar27 = uVar8;
  }
  uVar27 = T[(uint)uVar18 & 0x3ff] + uVar18 + uVar27;
  uVar19 = uVar18 << ((ulong)(byte)-((byte)uVar27 & 0x3f) & 0x3f) | uVar18 >> (uVar27 & 0x3f);
  if ((uVar27 & 0x3f) == 0) {
    uVar19 = uVar18;
  }
  uVar10 = uVar10 + T[(uint)uVar19 & 0x3ff] + uVar19;
  uVar18 = uVar19 << ((ulong)(byte)-((byte)uVar10 & 0x3f) & 0x3f) | uVar19 >> (uVar10 & 0x3f);
  if ((uVar10 & 0x3f) == 0) {
    uVar18 = uVar19;
  }
  uVar14 = T[(uint)uVar18 & 0x3ff];
  *puVar15 = uVar27;
  puVar15[1] = uVar10;
  uVar19 = uVar22 + uVar14 + uVar18;
  puVar15[2] = uVar19;
  uVar22 = uVar18 << ((ulong)(byte)-((byte)uVar19 & 0x3f) & 0x3f) | uVar18 >> (uVar19 & 0x3f);
  if ((uVar19 & 0x3f) == 0) {
    uVar22 = uVar18;
  }
  puVar15[3] = uVar22;
  if ((int)uVar6 < 1) {
    uVar13 = 0;
  }
  else {
    lVar25 = 1;
    iVar26 = 0;
    do {
      uVar22 = *(long *)((long)key + lVar25 * 8 + -8) + lVar25;
      bVar3 = (char)lVar25 + (char)puVar15[iVar26] & 0x3f;
      puVar15[iVar26] = (uVar22 >> bVar3 | uVar22 << 0x40 - bVar3) + puVar15[iVar26];
      puVar11 = puVar15 + 1;
      puVar23 = puVar15;
      if (iVar26 == 1) {
LAB_0016ed53:
        uVar22 = *puVar23;
        uVar27 = T[(uint)uVar22 & 0x3ff] + uVar22 + *puVar11;
        *puVar23 = uVar27;
        uVar10 = uVar22 << ((ulong)(byte)-((byte)uVar27 & 0x3f) & 0x3f) | uVar22 >> (uVar27 & 0x3f);
        if ((uVar27 & 0x3f) == 0) {
          uVar10 = uVar22;
        }
        *puVar11 = uVar10;
      }
      else if (iVar26 == 3) {
        iVar26 = -1;
        puVar11 = puVar15 + 3;
        puVar23 = puVar15 + 2;
        goto LAB_0016ed53;
      }
      lVar1 = (1 - uVar20) + lVar25;
      iVar26 = iVar26 + 1;
      lVar25 = lVar25 + 1;
    } while (lVar1 != 1);
    uVar27 = *puVar15;
    uVar10 = puVar15[1];
    uVar13 = uVar6;
  }
  uVar14 = T[(uint)uVar27 & 0x3ff] + uVar27 + uVar10;
  *puVar15 = uVar14;
  uVar16 = uVar13 * 8;
  uVar22 = uVar27 << ((ulong)(byte)-((byte)uVar14 & 0x3f) & 0x3f) | uVar27 >> (uVar14 & 0x3f);
  if ((uVar14 & 0x3f) == 0) {
    uVar22 = uVar27;
  }
  puVar15[1] = uVar22;
  if ((int)uVar16 < len) {
    uVar24 = uVar16 & 0x18;
    lVar25 = 0;
    uVar12 = uVar16;
    do {
      cVar4 = (char)uVar13 * '\b' + '\x01' + (char)lVar25;
      bVar17 = *(char *)((long)key + lVar25 + (ulong)uVar13 * 8) + cVar4;
      bVar3 = state8[(int)uVar24];
      bVar9 = cVar4 + bVar3 & 7;
      bVar9 = bVar17 >> bVar9 | bVar17 << 8 - bVar9;
      if ((bVar3 + 1 + (int)lVar25 & 7) == 0) {
        bVar9 = bVar17;
      }
      uVar19 = (ulong)(uVar16 + (uVar12 / 3) * -3 + (int)lVar25);
      state8[(int)uVar24] = bVar9 + bVar3;
      puVar15 = state;
      uVar22 = state[uVar19];
      uVar27 = T[(uint)uVar22 & 0x3ff] + uVar22 + state[uVar19 + 1];
      state[uVar19] = uVar27;
      uVar10 = uVar22 << ((ulong)(byte)-((byte)uVar27 & 0x3f) & 0x3f) | uVar22 >> (uVar27 & 0x3f);
      if ((uVar27 & 0x3f) == 0) {
        uVar10 = uVar22;
      }
      bVar2 = 0x1e < (int)uVar24;
      uVar24 = uVar24 + 1;
      if (bVar2) {
        uVar24 = 0;
      }
      lVar25 = lVar25 + 1;
      uVar12 = uVar12 + 1;
      puVar15[uVar19 + 1] = uVar10;
    } while ((ulong)(uint)len + (ulong)uVar13 * -8 != lVar25);
    uVar14 = *puVar15;
    uVar22 = puVar15[1];
  }
  uVar22 = T[(uint)uVar14 & 0x3ff] + uVar14 + uVar22;
  uVar10 = uVar14 << ((ulong)(byte)-((byte)uVar22 & 0x3f) & 0x3f) | uVar14 >> (uVar22 & 0x3f);
  if ((uVar22 & 0x3f) == 0) {
    uVar10 = uVar14;
  }
  uVar27 = puVar15[2] + T[(uint)uVar10 & 0x3ff] + uVar10;
  uVar19 = uVar10 << ((ulong)(byte)-((byte)uVar27 & 0x3f) & 0x3f) | uVar10 >> (uVar27 & 0x3f);
  if ((uVar27 & 0x3f) == 0) {
    uVar19 = uVar10;
  }
  uVar14 = T[(uint)uVar19 & 0x3ff];
  *puVar15 = uVar22;
  puVar15[1] = uVar27;
  uVar18 = puVar15[3] + uVar14 + uVar19;
  puVar15[2] = uVar18;
  uVar10 = uVar19 << ((ulong)(byte)-((byte)uVar18 & 0x3f) & 0x3f) | uVar19 >> (uVar18 & 0x3f);
  if ((uVar18 & 0x3f) == 0) {
    uVar10 = uVar19;
  }
  puVar15[3] = uVar10;
  if ((int)uVar6 < 1) {
    uVar13 = 0;
  }
  else {
    lVar25 = 1;
    iVar26 = 0;
    do {
      uVar22 = *(long *)((long)key + lVar25 * 8 + -8) + lVar25;
      bVar3 = (char)lVar25 + (char)puVar15[iVar26] & 0x3f;
      puVar15[iVar26] = (uVar22 >> bVar3 | uVar22 << 0x40 - bVar3) + puVar15[iVar26];
      puVar11 = puVar15 + 1;
      puVar23 = puVar15;
      if (iVar26 == 1) {
LAB_0016f011:
        uVar22 = *puVar23;
        uVar27 = T[(uint)uVar22 & 0x3ff] + uVar22 + *puVar11;
        *puVar23 = uVar27;
        uVar10 = uVar22 << ((ulong)(byte)-((byte)uVar27 & 0x3f) & 0x3f) | uVar22 >> (uVar27 & 0x3f);
        if ((uVar27 & 0x3f) == 0) {
          uVar10 = uVar22;
        }
        *puVar11 = uVar10;
      }
      else if (iVar26 == 3) {
        iVar26 = -1;
        puVar11 = puVar15 + 3;
        puVar23 = puVar15 + 2;
        goto LAB_0016f011;
      }
      lVar1 = (1 - uVar20) + lVar25;
      iVar26 = iVar26 + 1;
      lVar25 = lVar25 + 1;
    } while (lVar1 != 1);
    uVar22 = *puVar15;
    uVar27 = puVar15[1];
    uVar13 = uVar6;
  }
  uVar14 = T[(uint)uVar22 & 0x3ff] + uVar22 + uVar27;
  *puVar15 = uVar14;
  uVar16 = uVar13 * 8;
  uVar10 = uVar22 << ((ulong)(byte)-((byte)uVar14 & 0x3f) & 0x3f) | uVar22 >> (uVar14 & 0x3f);
  if ((uVar14 & 0x3f) == 0) {
    uVar10 = uVar22;
  }
  puVar15[1] = uVar10;
  if ((int)uVar16 < len) {
    uVar24 = uVar16 & 0x18;
    lVar25 = 0;
    uVar12 = uVar16;
    do {
      cVar4 = (char)uVar13 * '\b' + '\x01' + (char)lVar25;
      bVar17 = *(char *)((long)key + lVar25 + (ulong)uVar13 * 8) + cVar4;
      bVar3 = state8[(int)uVar24];
      bVar9 = cVar4 + bVar3 & 7;
      bVar9 = bVar17 >> bVar9 | bVar17 << 8 - bVar9;
      if ((bVar3 + 1 + (int)lVar25 & 7) == 0) {
        bVar9 = bVar17;
      }
      uVar19 = (ulong)(uVar16 + (uVar12 / 3) * -3 + (int)lVar25);
      state8[(int)uVar24] = bVar9 + bVar3;
      puVar15 = state;
      uVar22 = state[uVar19];
      uVar27 = T[(uint)uVar22 & 0x3ff] + uVar22 + state[uVar19 + 1];
      state[uVar19] = uVar27;
      uVar10 = uVar22 << ((ulong)(byte)-((byte)uVar27 & 0x3f) & 0x3f) | uVar22 >> (uVar27 & 0x3f);
      if ((uVar27 & 0x3f) == 0) {
        uVar10 = uVar22;
      }
      bVar2 = 0x1e < (int)uVar24;
      uVar24 = uVar24 + 1;
      if (bVar2) {
        uVar24 = 0;
      }
      lVar25 = lVar25 + 1;
      uVar12 = uVar12 + 1;
      puVar15[uVar19 + 1] = uVar10;
    } while ((ulong)(uint)len + (ulong)uVar13 * -8 != lVar25);
    uVar14 = *puVar15;
    uVar10 = puVar15[1];
  }
  uVar10 = T[(uint)uVar14 & 0x3ff] + uVar14 + uVar10;
  uVar22 = uVar14 << ((ulong)(byte)-((byte)uVar10 & 0x3f) & 0x3f) | uVar14 >> (uVar10 & 0x3f);
  if ((uVar10 & 0x3f) == 0) {
    uVar22 = uVar14;
  }
  uVar19 = T[(uint)uVar22 & 0x3ff] + uVar22 + puVar15[2];
  uVar27 = uVar22 << ((ulong)(byte)-((byte)uVar19 & 0x3f) & 0x3f) | uVar22 >> (uVar19 & 0x3f);
  if ((uVar19 & 0x3f) == 0) {
    uVar27 = uVar22;
  }
  uVar18 = T[(uint)uVar27 & 0x3ff] + uVar27 + puVar15[3];
  *puVar15 = uVar10;
  puVar15[1] = uVar19;
  puVar15[2] = uVar18;
  uVar22 = uVar27 << ((ulong)(byte)-((byte)uVar18 & 0x3f) & 0x3f) | uVar27 >> (uVar18 & 0x3f);
  if ((uVar18 & 0x3f) == 0) {
    uVar22 = uVar27;
  }
  puVar15[3] = uVar22;
  puVar5 = state;
  if ((int)uVar6 < 1) {
    uVar6 = 0;
  }
  else {
    lVar25 = 1;
    iVar26 = 0;
    puVar11 = state + 1;
    do {
      uVar22 = *(long *)((long)key + lVar25 * 8 + -8) + lVar25;
      bVar3 = (char)lVar25 + (char)puVar15[iVar26] & 0x3f;
      puVar15[iVar26] = (uVar22 >> bVar3 | uVar22 << 0x40 - bVar3) + puVar15[iVar26];
      if (iVar26 == 3) {
        uVar22 = puVar15[2];
        iVar26 = -1;
        uVar10 = T[(uint)uVar22 & 0x3ff] + uVar22 + puVar15[3];
        puVar15[2] = uVar10;
        puVar23 = puVar15 + 3;
LAB_0016f314:
        uVar27 = uVar22 << ((ulong)(byte)-((byte)uVar10 & 0x3f) & 0x3f) | uVar22 >> (uVar10 & 0x3f);
        if ((uVar10 & 0x3f) == 0) {
          uVar27 = uVar22;
        }
        *puVar23 = uVar27;
      }
      else if (iVar26 == 1) {
        uVar22 = *puVar15;
        *puVar15 = T[(uint)uVar22 & 0x3ff] + uVar22 + puVar15[1] ^ uVar22;
        puVar15[1] = uVar22;
        iVar26 = 1;
        uVar22 = puVar5[1];
        uVar10 = *puVar5 ^ uVar22;
        *puVar5 = uVar10;
        puVar23 = puVar11;
        goto LAB_0016f314;
      }
      lVar1 = (1 - uVar20) + lVar25;
      iVar26 = iVar26 + 1;
      lVar25 = lVar25 + 1;
    } while (lVar1 != 1);
  }
  puVar15 = state;
  uVar20 = *state;
  uVar10 = T[(uint)uVar20 & 0x3ff] + uVar20 + state[1];
  *state = uVar10;
  uVar13 = uVar6 * 8;
  uVar22 = uVar20 << ((ulong)(byte)-((byte)uVar10 & 0x3f) & 0x3f) | uVar20 >> (uVar10 & 0x3f);
  if ((uVar10 & 0x3f) == 0) {
    uVar22 = uVar20;
  }
  puVar15[1] = uVar22;
  if ((int)uVar13 < len) {
    uVar16 = uVar13 & 0x18;
    lVar25 = 0;
    uVar24 = uVar13;
    do {
      cVar4 = (char)uVar6 * '\b' + '\x01' + (char)lVar25;
      bVar17 = *(char *)((long)key + lVar25 + (ulong)uVar6 * 8) + cVar4;
      bVar3 = state8[(int)uVar16];
      bVar9 = cVar4 + bVar3 & 7;
      bVar9 = bVar17 >> bVar9 | bVar17 << 8 - bVar9;
      if ((bVar3 + 1 + (int)lVar25 & 7) == 0) {
        bVar9 = bVar17;
      }
      uVar27 = (ulong)(uVar13 + (uVar24 / 3) * -3 + (int)lVar25);
      state8[(int)uVar16] = bVar9 + bVar3;
      puVar15 = state;
      uVar20 = state[uVar27];
      uVar10 = T[(uint)uVar20 & 0x3ff] + uVar20 + state[uVar27 + 1];
      state[uVar27] = uVar10;
      uVar22 = uVar20 << ((ulong)(byte)-((byte)uVar10 & 0x3f) & 0x3f) | uVar20 >> (uVar10 & 0x3f);
      if ((uVar10 & 0x3f) == 0) {
        uVar22 = uVar20;
      }
      puVar15[uVar27 + 1] = uVar22;
      bVar2 = 0x1e < (int)uVar16;
      uVar16 = uVar16 + 1;
      if (bVar2) {
        uVar16 = 0;
      }
      lVar25 = lVar25 + 1;
      uVar24 = uVar24 + 1;
    } while ((ulong)(uint)len + (ulong)uVar6 * -8 != lVar25);
  }
  puVar15 = state;
  uVar20 = *state;
  uVar10 = T[(uint)uVar20 & 0x3ff] + uVar20 + state[1];
  *state = uVar10;
  uVar22 = uVar20 << ((ulong)(byte)-((byte)uVar10 & 0x3f) & 0x3f) | uVar20 >> (uVar10 & 0x3f);
  if ((uVar10 & 0x3f) == 0) {
    uVar22 = uVar20;
  }
  uVar10 = T[(uint)uVar22 & 0x3ff] + uVar22 + puVar15[2];
  puVar15[1] = uVar10;
  uVar20 = uVar22 << ((ulong)(byte)-((byte)uVar10 & 0x3f) & 0x3f) | uVar22 >> (uVar10 & 0x3f);
  if ((uVar10 & 0x3f) == 0) {
    uVar20 = uVar22;
  }
  uVar10 = T[(uint)uVar20 & 0x3ff] + uVar20 + puVar15[3];
  puVar15[2] = uVar10;
  uVar22 = uVar20 << ((ulong)(byte)-((byte)uVar10 & 0x3f) & 0x3f) | uVar20 >> (uVar10 & 0x3f);
  if ((uVar10 & 0x3f) == 0) {
    uVar22 = uVar20;
  }
  puVar15[3] = uVar22;
  *(ulong *)out = uVar22 + uVar10;
  return;
}

Assistant:

void beamsplitter_64 ( const void * key, int len, unsigned seed, void * out )
    {
      const uint8_t *key8Arr = (uint8_t *)key;
      const uint64_t *key64Arr = (uint64_t *)key;

      uint8_t seedbuf[8] = {0};
      uint8_t *seed8Arr = (uint8_t *)seedbuf;
      uint64_t *seed64Arr = (uint64_t *)seedbuf;
      uint32_t *seed32Arr = (uint32_t *)seedbuf;

      // the cali number from the Matrix (1999)
      seed32Arr[0] = 0xc5550690;
      seed32Arr[0] -= seed;
      seed32Arr[1] = ~(1 - seed);

      // nothing up my sleeve
      state[0] = 0x123456789abcdef0;
      state[1] = 0x0fedcba987654321;
      state[2] = 0xaccadacca80081e5;
      state[3] = 0xf00baaf00f00baaa;

      round( key64Arr, key8Arr, len );
      round( key64Arr, key8Arr, len );
      round( key64Arr, key8Arr, len );
      round( seed64Arr, seed8Arr, 8 );
      //round( state, state8, STATE   );
      round( seed64Arr, seed8Arr, 8 );
      round( key64Arr, key8Arr, len );
      round( key64Arr, key8Arr, len );
      round( key64Arr, key8Arr, len );

      /*
      //printf("state = %#018" PRIx64 " %#018" PRIx64 " %#018" PRIx64 " %#018" PRIx64 "\n",
      //  state[0], state[1], state[2], state[3] );
      */

      //printf("state = %#018" PRIx64 " %#018" PRIx64 "\n",
      //  state[0], state[1] );

      uint8_t output[STATE] = {0};
      uint64_t *h = (uint64_t *)output;

      // The new combination step
      h[0] = state[2];
      h[1] = state[3];

      h[0] += h[1];

      ((uint64_t *)out)[0] = h[0];
    }